

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

SqASTData *
SQCompilation::ParseToAST
          (SQVM *vm,char *sourceText,size_t sourceTextSize,SQChar *sourcename,bool preserveComments,
          bool raiseerror)

{
  SQAllocContext pSVar1;
  Arena *astArena;
  Comments *comments;
  SqASTData *p;
  RootBlock *pRVar2;
  undefined7 in_register_00000081;
  SQChar *__dest;
  
  astArena = (Arena *)sq_vm_malloc(vm->_sharedstate->_alloc_ctx,0x28);
  pSVar1 = vm->_sharedstate->_alloc_ctx;
  comments = (Comments *)0x0;
  astArena->_chunks = (Chunk *)0x0;
  astArena->_alloc_ctx = pSVar1;
  astArena->_bigChunks = (BigChunk *)0x0;
  astArena->_name = "AST";
  astArena->_chunkSize = 0x4000;
  if ((int)CONCAT71(in_register_00000081,preserveComments) != 0) {
    comments = (Comments *)sq_vm_malloc(pSVar1,0x18);
    pSVar1 = vm->_sharedstate->_alloc_ctx;
    (comments->_commentsList)._vals = (sqvector<SQCompilation::CommentData,_unsigned_int> *)0x0;
    (comments->_commentsList)._alloc_ctx = pSVar1;
    (comments->_commentsList)._size = 0;
    (comments->_commentsList)._allocated = 0;
  }
  p = (SqASTData *)sq_vm_malloc(vm->_sharedstate->_alloc_ctx,0x118);
  __dest = p->sourceName;
  if (sourcename == (SQChar *)0x0) {
    *__dest = '\0';
  }
  else {
    strncpy(__dest,sourcename,0x100);
    p->sourceName[0xff] = '\0';
  }
  pRVar2 = parseASTImpl(astArena,vm,sourceText,sourceTextSize,__dest,comments,raiseerror);
  if (pRVar2 == (RootBlock *)0x0) {
    if (comments != (Comments *)0x0) {
      Comments::~Comments(comments);
      sq_vm_free(vm->_sharedstate->_alloc_ctx,comments,0x18);
    }
    Arena::release(astArena);
    sq_vm_free(vm->_sharedstate->_alloc_ctx,astArena,0x28);
    sq_vm_free(vm->_sharedstate->_alloc_ctx,p,0x118);
    p = (SqASTData *)0x0;
  }
  else {
    p->astArena = astArena;
    p->root = pRVar2;
    p->comments = comments;
  }
  return p;
}

Assistant:

SqASTData *ParseToAST(SQVM *vm, const char *sourceText, size_t sourceTextSize, const SQChar *sourcename, bool preserveComments, bool raiseerror) {

  void *arenaPtr = sq_vm_malloc(_ss(vm)->_alloc_ctx, sizeof(Arena));
  Arena *astArena = new (arenaPtr) Arena(_ss(vm)->_alloc_ctx, "AST");
  Comments *comments = nullptr;
  if (preserveComments) {
    void *commentsPtr = sq_vm_malloc(_ss(vm)->_alloc_ctx, sizeof(Comments));
    comments = new (commentsPtr) Comments(_ss(vm)->_alloc_ctx);
  }

  SqASTData *astData = (SqASTData *)sq_vm_malloc(_ss(vm)->_alloc_ctx, sizeof(SqASTData));
  if (sourcename) {
    strncpy(astData->sourceName, sourcename, sizeof(astData->sourceName));
    astData->sourceName[sizeof(astData->sourceName) / sizeof(astData->sourceName[0]) - 1] = 0;
  }
  else
    astData->sourceName[0] = 0;

  RootBlock *r = parseASTImpl(astArena, vm, sourceText, sourceTextSize, astData->sourceName, comments, raiseerror);

  if (!r) {
    if (comments) {
      comments->~Comments();
      sq_vm_free(_ss(vm)->_alloc_ctx, comments, sizeof(Comments));
    }
    astArena->~Arena();
    sq_vm_free(_ss(vm)->_alloc_ctx, astArena, sizeof(Arena));
    sq_vm_free(_ss(vm)->_alloc_ctx, astData, sizeof(SqASTData));
    return nullptr;
  }

  astData->astArena = astArena;
  astData->root = r;
  astData->comments = comments;

  return astData;
}